

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::
set_pattern(ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this,
           string *pattern)

{
  pthread_mutex_t *__mutex;
  formatter *pfVar1;
  pattern_formatter *this_00;
  allocator local_61;
  string local_60;
  string local_40;
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  std::mutex::lock((mutex *)&__mutex->__data);
  this_00 = (pattern_formatter *)operator_new(0xa8);
  std::__cxx11::string::string((string *)&local_40,(string *)pattern);
  std::__cxx11::string::string((string *)&local_60,"\n",&local_61);
  pattern_formatter::pattern_formatter(this_00,&local_40,local,&local_60);
  pfVar1 = (this->super_sink).formatter_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (this->super_sink).formatter_._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)this_00;
  if (pfVar1 != (formatter *)0x0) {
    (*pfVar1->_vptr_formatter[1])();
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void set_pattern(const std::string &pattern) final
    {
        std::lock_guard<mutex_t> lock(mutex_);
        formatter_ = std::unique_ptr<spdlog::formatter>(new pattern_formatter(pattern));
    }